

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceOptions::MergeFrom(ServiceOptions *this,ServiceOptions *from)

{
  bool bVar1;
  void *pvVar2;
  
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    bVar1 = from->deprecated_;
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
    this->deprecated_ = bVar1;
  }
  return;
}

Assistant:

void ServiceOptions::MergeFrom(const ServiceOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._internal_has_deprecated()) {
    _internal_set_deprecated(from._internal_deprecated());
  }
}